

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

U32 ZSTD_rawLiteralsCost(BYTE *literals,U32 litLength,optState_t *optPtr)

{
  U32 UVar1;
  long *in_RDX;
  uint in_ESI;
  long in_RDI;
  U32 cost_1;
  U32 u_1;
  U32 cost;
  U32 u;
  U32 local_30;
  uint local_2c;
  U32 local_28;
  uint local_24;
  U32 local_4;
  
  if (in_ESI == 0) {
    local_4 = 0;
  }
  else if ((int)in_RDX[10] == 1) {
    local_4 = in_ESI * 6;
  }
  else if ((int)in_RDX[10] == 2) {
    local_28 = 0;
    for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
      UVar1 = HUF_getNbBits((void *)in_RDX[0xb],(uint)*(byte *)(in_RDI + (ulong)local_24));
      local_28 = UVar1 + local_28;
    }
    local_4 = local_28;
  }
  else {
    local_30 = in_ESI * (int)in_RDX[8];
    for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
      UVar1 = ZSTD_highbit32(*(int *)(*in_RDX + (ulong)*(byte *)(in_RDI + (ulong)local_2c) * 4) + 1)
      ;
      local_30 = local_30 - UVar1;
    }
    local_4 = local_30;
  }
  return local_4;
}

Assistant:

static U32 ZSTD_rawLiteralsCost(const BYTE* const literals, U32 const litLength,
                                const optState_t* const optPtr)
{
    if (litLength == 0) return 0;
    if (optPtr->priceType == zop_predef) return (litLength*6);  /* 6 bit per literal - no statistic used */
    if (optPtr->priceType == zop_static) {
        U32 u, cost;
        assert(optPtr->symbolCosts != NULL);
        assert(optPtr->symbolCosts->hufCTable_repeatMode == HUF_repeat_valid);
        for (u=0, cost=0; u < litLength; u++)
            cost += HUF_getNbBits(optPtr->symbolCosts->hufCTable, literals[u]);
        return cost * BITCOST_MULTIPLIER;
    }

    /* dynamic statistics */
    {   U32 u;
        U32 cost = litLength * optPtr->log2litSum;
        for (u=0; u < litLength; u++)
            cost -= ZSTD_highbit32(optPtr->litFreq[literals[u]]+1);
        return cost * BITCOST_MULTIPLIER;
    }
}